

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_policy_format.c
# Opt level: O2

log_policy
log_policy_format_custom
          (void *context,log_policy_format_custom_size_ptr format_size,
          log_policy_format_custom_serialize_ptr format_serialize,
          log_policy_format_custom_deserialize_ptr format_deserialize)

{
  log_policy_interface iface;
  log_policy plVar1;
  log_policy_format_custom_ctor_type custom_ctor;
  void *local_28;
  log_policy_format_custom_size_ptr local_20;
  log_policy_format_custom_serialize_ptr local_18;
  log_policy_format_custom_deserialize_ptr local_10;
  
  local_28 = context;
  local_20 = format_size;
  local_18 = format_serialize;
  local_10 = format_deserialize;
  iface = log_policy_format_custom_interface();
  plVar1 = log_policy_create(LOG_ASPECT_FORMAT,iface,&local_28);
  return plVar1;
}

Assistant:

log_policy log_policy_format_custom(void *context, log_policy_format_custom_size_ptr format_size, log_policy_format_custom_serialize_ptr format_serialize, log_policy_format_custom_deserialize_ptr format_deserialize)
{
	struct log_policy_format_custom_ctor_type custom_ctor;

	custom_ctor.context = context;
	custom_ctor.format_size = format_size;
	custom_ctor.format_serialize = format_serialize;
	custom_ctor.format_deserialize = format_deserialize;

	return log_policy_create(LOG_ASPECT_FORMAT, log_policy_format(LOG_POLICY_FORMAT_CUSTOM), &custom_ctor);
}